

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O0

ssize_t __thiscall wasm::ModuleReader::read(ModuleReader *this,int __fd,void *__buf,size_t __nbytes)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  Module *__lhs;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  size_t local_28;
  string *sourceMapFilename_local;
  Module *wasm_local;
  string *filename_local;
  ModuleReader *this_local;
  
  __lhs = (Module *)CONCAT44(in_register_00000034,__fd);
  local_28 = __nbytes;
  sourceMapFilename_local = (string *)__buf;
  wasm_local = __lhs;
  filename_local = (string *)this;
  lVar3 = std::__cxx11::string::size();
  if ((lVar3 != 0) &&
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"-"), !bVar2)) {
    std::__cxx11::string::string((string *)&local_78,(string *)__lhs);
    bVar2 = isBinaryFile(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (!bVar2) {
      lVar3 = std::__cxx11::string::size();
      if (lVar3 != 0) {
        std::operator<<((ostream *)&std::cerr,
                        "Binaryen ModuleReader::read() - source map filename provided, but file appears to not be binary\n"
                       );
      }
      std::__cxx11::string::string((string *)&local_d8,(string *)__lhs);
      readText(this,&local_d8,(Module *)sourceMapFilename_local);
      sVar4 = std::__cxx11::string::~string((string *)&local_d8);
      return sVar4;
    }
    std::__cxx11::string::string((string *)&local_98,(string *)__lhs);
    psVar1 = sourceMapFilename_local;
    std::__cxx11::string::string((string *)&local_b8,(string *)__nbytes);
    readBinary(this,&local_98,(Module *)psVar1,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    sVar4 = std::__cxx11::string::~string((string *)&local_98);
    return sVar4;
  }
  psVar1 = sourceMapFilename_local;
  std::__cxx11::string::string((string *)&local_48,(string *)__nbytes);
  readStdin(this,(Module *)psVar1,&local_48);
  sVar4 = std::__cxx11::string::~string((string *)&local_48);
  return sVar4;
}

Assistant:

void ModuleReader::read(std::string filename,
                        Module& wasm,
                        std::string sourceMapFilename) {
  // empty filename or "-" means read from stdin
  if (!filename.size() || filename == "-") {
    readStdin(wasm, sourceMapFilename);
    return;
  }
  if (isBinaryFile(filename)) {
    readBinary(filename, wasm, sourceMapFilename);
  } else {
    // default to text
    if (sourceMapFilename.size()) {
      std::cerr << "Binaryen ModuleReader::read() - source map filename "
                   "provided, but file appears to not be binary\n";
    }
    readText(filename, wasm);
  }
}